

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

void Gia_ManSimPatSimPo(Gia_Man_t *p,int i,Gia_Obj_t *pObj,int nWords,Vec_Wrd_t *vSims)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  undefined4 in_register_0000000c;
  int iVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  ulong uVar6;
  
  uVar1 = *(uint *)CONCAT44(in_register_00000034,i);
  uVar2 = *(ulong *)((long)Cnf_CutDeriveTruth::C + (ulong)(uVar1 >> 0x1a & 8));
  lVar3 = *(long *)(CONCAT44(in_register_0000000c,nWords) + 8);
  iVar4 = (int)pObj;
  uVar6 = 0;
  uVar5 = (ulong)pObj & 0xffffffff;
  if (iVar4 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    *(ulong *)(lVar3 + (long)(iVar4 * (int)p) * 8 + uVar6 * 8) =
         *(ulong *)(lVar3 + (long)(int)(((int)p - (uVar1 & 0x1fffffff)) * iVar4) * 8 + uVar6 * 8) ^
         uVar2;
  }
  return;
}

Assistant:

static inline int          Gia_ObjFaninC0( Gia_Obj_t * pObj )                  { return pObj->fCompl0;        }